

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::CellConservativeProtected::protect
          (CellConservativeProtected *this,FArrayBox *param_1,int param_2,FArrayBox *fine,
          int param_4,FArrayBox *fine_state,int param_6,int ncomp,Box *fine_region,IntVect *ratio,
          Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  int iVar15;
  undefined8 uVar16;
  long lVar17;
  int n;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  int k_1;
  int iVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int j;
  int j_2;
  long lVar59;
  double *pdVar60;
  bool bVar61;
  ulong uVar62;
  double dVar63;
  Real alpha;
  double dVar64;
  double dVar65;
  Real posVal;
  double dVar66;
  double dVar67;
  int local_1cc;
  double *local_1a8;
  Box target_fine_region;
  Box crse_bx;
  
  target_fine_region.smallend.vect._0_8_ = *(undefined8 *)(fine_region->smallend).vect;
  uVar16 = *(undefined8 *)((fine_region->smallend).vect + 2);
  target_fine_region._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  target_fine_region.bigend.vect[1] =
       (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  target_fine_region.smallend.vect[2] = (int)uVar16;
  target_fine_region.bigend.vect[0] = (int)((ulong)uVar16 >> 0x20);
  Box::operator&=(&target_fine_region,&(fine->super_BaseFab<double>).domain);
  (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
            (&crse_bx,this,&target_fine_region,ratio);
  pdVar13 = (fine->super_BaseFab<double>).dptr;
  iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  lVar40 = (long)iVar1;
  iVar2 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  lVar45 = (long)iVar2;
  iVar3 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  lVar43 = (long)((iVar3 - iVar2) + 1);
  pdVar14 = (fine_state->super_BaseFab<double>).dptr;
  iVar4 = (fine_state->super_BaseFab<double>).domain.smallend.vect[0];
  iVar5 = (fine_state->super_BaseFab<double>).domain.smallend.vect[2];
  lVar36 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  iVar47 = crse_bx.smallend.vect[0] + 1;
  iVar6 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  lVar58 = (long)iVar6;
  iVar7 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
  iVar8 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
  lVar30 = (long)((iVar7 - iVar1) + 1);
  lVar21 = (long)((iVar8 - iVar6) + 1);
  lVar41 = lVar21 * lVar30;
  iVar9 = (fine_state->super_BaseFab<double>).domain.smallend.vect[1];
  lVar59 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  lVar38 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[1] - iVar9) + 1);
  iVar10 = ratio->vect[0];
  iVar11 = ratio->vect[1];
  iVar12 = ratio->vect[2];
  iVar55 = (crse_bx.smallend.vect[2] + 1) * iVar12;
  lVar44 = lVar43 * lVar41;
  lVar39 = lVar38 * lVar59;
  do {
    lVar31 = (long)iVar55;
    if (iVar55 < lVar45) {
      lVar31 = lVar45;
    }
    iVar53 = iVar55;
    if (iVar55 < iVar2) {
      iVar53 = iVar2;
    }
    crse_bx.smallend.vect[2] = crse_bx.smallend.vect[2] + 1;
    if (crse_bx.bigend.vect[2] <= crse_bx.smallend.vect[2]) {
      return;
    }
    lVar22 = (long)iVar53;
    iVar53 = crse_bx.smallend.vect[2] * iVar12;
    iVar18 = iVar2;
    if (iVar2 < iVar53) {
      iVar18 = iVar53;
    }
    iVar53 = iVar53 + iVar12 + -1;
    if (iVar3 < iVar53) {
      iVar53 = iVar3;
    }
    lVar32 = (long)iVar53;
    local_1cc = crse_bx.smallend.vect[1];
    iVar49 = (crse_bx.smallend.vect[1] + 1) * iVar11;
    while( true ) {
      lVar33 = (long)iVar49;
      if (iVar49 < lVar58) {
        lVar33 = lVar58;
      }
      iVar48 = iVar49;
      if (iVar49 < iVar6) {
        iVar48 = iVar6;
      }
      local_1cc = local_1cc + 1;
      if (crse_bx.bigend.vect[1] <= local_1cc) break;
      if (iVar47 < crse_bx.bigend.vect[0]) {
        lVar23 = (long)iVar48;
        iVar48 = local_1cc * iVar11;
        iVar19 = iVar6;
        if (iVar6 < iVar48) {
          iVar19 = iVar48;
        }
        iVar48 = iVar48 + iVar11 + -1;
        if (iVar8 < iVar48) {
          iVar48 = iVar8;
        }
        lVar54 = (long)iVar48;
        lVar17 = ((lVar43 * 8 + lVar45 * -8 + lVar31 * 8) * lVar21 + lVar58 * -8 + lVar33 * 8) *
                 lVar30 + lVar40 * -8;
        iVar29 = iVar10 * iVar47;
        iVar15 = iVar47;
        do {
          lVar52 = (long)iVar29;
          if (iVar29 < lVar40) {
            lVar52 = lVar40;
          }
          local_1a8 = (double *)((long)pdVar13 + lVar52 * 8 + lVar17);
          lVar27 = (long)pdVar13 + lVar52 * 8 + lVar17;
          lVar57 = (long)pdVar14 +
                   lVar52 * 8 +
                   ((lVar36 * 8 + (long)iVar5 * -8 + lVar31 * 8) * lVar38 + (long)iVar9 * -8 +
                   lVar33 * 8) * lVar59 + (long)iVar4 * -8;
          iVar20 = iVar15 * iVar10;
          iVar28 = iVar1;
          if (iVar1 < iVar20) {
            iVar28 = iVar20;
          }
          iVar20 = iVar20 + iVar10 + -1;
          if (iVar7 < iVar20) {
            iVar20 = iVar7;
          }
          lVar37 = (long)iVar20;
          dVar63 = (double)(((iVar20 - iVar28) + 1) *
                           ((iVar48 - iVar19) + 1) * ((iVar53 - iVar18) + 1));
          for (lVar26 = 1; lVar25 = lVar22, lVar26 < ncomp + -1; lVar26 = lVar26 + 1) {
            bVar61 = false;
            lVar25 = lVar27;
            lVar56 = lVar57;
            for (lVar50 = (long)iVar18; lVar24 = lVar25, lVar42 = (long)iVar19, lVar51 = lVar56,
                lVar50 <= lVar32; lVar50 = lVar50 + 1) {
              for (; lVar42 <= lVar54; lVar42 = lVar42 + 1) {
                for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                  bVar61 = (bool)(bVar61 | *(double *)(lVar51 + lVar34 * 8) +
                                           *(double *)(lVar24 + lVar34 * 8) < 0.0);
                }
                lVar24 = lVar24 + lVar30 * 8;
                lVar51 = lVar51 + lVar59 * 8;
              }
              lVar25 = lVar25 + lVar41 * 8;
              lVar56 = lVar56 + lVar39 * 8;
            }
            if (bVar61) {
              dVar64 = 0.0;
              dVar66 = 0.0;
              dVar65 = 0.0;
              lVar25 = lVar57;
              lVar56 = lVar27;
              for (lVar50 = (long)iVar18; lVar24 = lVar25, lVar42 = lVar56, lVar51 = (long)iVar19,
                  lVar50 <= lVar32; lVar50 = lVar50 + 1) {
                for (; lVar51 <= lVar54; lVar51 = lVar51 + 1) {
                  for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                    dVar67 = *(double *)(lVar24 + lVar34 * 8);
                    if (dVar67 <= 0.0) {
                      dVar66 = dVar66 + dVar67;
                    }
                    dVar64 = dVar64 + *(double *)(lVar42 + lVar34 * 8);
                    dVar65 = (double)(~-(ulong)(0.0 < dVar67) & (ulong)dVar65 |
                                     (ulong)(dVar65 + dVar67) & -(ulong)(0.0 < dVar67));
                  }
                  lVar24 = lVar24 + lVar59 * 8;
                  lVar42 = lVar42 + lVar30 * 8;
                }
                lVar25 = lVar25 + lVar39 * 8;
                lVar56 = lVar56 + lVar41 * 8;
              }
              if (dVar64 <= 0.0) {
LAB_0046412d:
                if (dVar64 < 0.0) {
                  if (ABS(dVar64) <= dVar65) {
                    if (ABS(dVar64) < dVar65) {
                      dVar67 = dVar66 + dVar65 + dVar64;
                      if (dVar67 <= 0.0) {
                        if (dVar67 < 0.0) {
                          lVar25 = lVar57;
                          lVar50 = lVar27;
                          for (lVar56 = lVar22; lVar24 = lVar25, lVar42 = lVar23, lVar51 = lVar50,
                              lVar56 <= lVar32; lVar56 = lVar56 + 1) {
                            for (; lVar42 <= lVar54; lVar42 = lVar42 + 1) {
                              for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                                dVar67 = *(double *)(lVar24 + lVar34 * 8);
                                uVar62 = -(ulong)(-dVar67 < dVar67);
                                *(ulong *)(lVar51 + lVar34 * 8) =
                                     ~uVar62 & (ulong)(((dVar64 + dVar65) / dVar66) * dVar67) |
                                     (ulong)-dVar67 & uVar62;
                              }
                              lVar24 = lVar24 + lVar59 * 8;
                              lVar51 = lVar51 + lVar30 * 8;
                            }
                            lVar50 = lVar50 + lVar41 * 8;
                            lVar25 = lVar25 + lVar39 * 8;
                          }
                        }
                      }
                      else {
                        lVar25 = lVar57;
                        lVar50 = lVar27;
                        for (lVar56 = lVar22; lVar24 = lVar25, lVar42 = lVar23, lVar51 = lVar50,
                            lVar56 <= lVar32; lVar56 = lVar56 + 1) {
                          for (; lVar42 <= lVar54; lVar42 = lVar42 + 1) {
                            for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                              dVar67 = *(double *)(lVar24 + lVar34 * 8);
                              uVar62 = -(ulong)(dVar67 < -dVar67);
                              *(ulong *)(lVar51 + lVar34 * 8) =
                                   ~uVar62 & (ulong)(((dVar64 + dVar66) / dVar65) * dVar67) |
                                   (ulong)-dVar67 & uVar62;
                            }
                            lVar24 = lVar24 + lVar59 * 8;
                            lVar51 = lVar51 + lVar30 * 8;
                          }
                          lVar50 = lVar50 + lVar41 * 8;
                          lVar25 = lVar25 + lVar39 * 8;
                        }
                      }
                    }
                  }
                  else {
                    lVar25 = lVar57;
                    lVar50 = lVar27;
                    for (lVar56 = lVar22; lVar24 = lVar25, lVar42 = lVar50, lVar51 = lVar23,
                        lVar56 <= lVar32; lVar56 = lVar56 + 1) {
                      for (; lVar51 <= lVar54; lVar51 = lVar51 + 1) {
                        for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                          *(double *)(lVar42 + lVar34 * 8) =
                               (dVar64 + dVar66 + dVar65) / dVar63 -
                               *(double *)(lVar24 + lVar34 * 8);
                        }
                        lVar24 = lVar24 + lVar59 * 8;
                        lVar42 = lVar42 + lVar30 * 8;
                      }
                      lVar50 = lVar50 + lVar41 * 8;
                      lVar25 = lVar25 + lVar39 * 8;
                    }
                  }
                }
              }
              else {
                dVar67 = ABS(dVar66);
                if (dVar64 <= dVar67) {
                  if (dVar67 <= dVar64) goto LAB_0046412d;
                  lVar25 = lVar57;
                  lVar50 = lVar27;
                  for (lVar56 = lVar22; lVar24 = lVar25, lVar42 = lVar50, lVar51 = lVar23,
                      lVar56 <= lVar32; lVar56 = lVar56 + 1) {
                    for (; lVar51 <= lVar54; lVar51 = lVar51 + 1) {
                      for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                        dVar65 = *(double *)(lVar24 + lVar34 * 8);
                        *(ulong *)(lVar42 + lVar34 * 8) =
                             -(ulong)(dVar65 < 0.0) & (ulong)(ABS(dVar65) * (dVar64 / dVar67));
                      }
                      lVar24 = lVar24 + lVar59 * 8;
                      lVar42 = lVar42 + lVar30 * 8;
                    }
                    lVar50 = lVar50 + lVar41 * 8;
                    lVar25 = lVar25 + lVar39 * 8;
                  }
                }
                else {
                  lVar25 = lVar57;
                  lVar50 = lVar27;
                  for (lVar56 = lVar22; lVar24 = lVar25, lVar42 = lVar50, lVar51 = lVar23,
                      lVar56 <= lVar32; lVar56 = lVar56 + 1) {
                    for (; lVar51 <= lVar54; lVar51 = lVar51 + 1) {
                      for (lVar34 = 0; lVar34 + lVar52 <= lVar37; lVar34 = lVar34 + 1) {
                        dVar66 = *(double *)(lVar24 + lVar34 * 8);
                        if (dVar66 < 0.0) {
                          *(double *)(lVar42 + lVar34 * 8) = -dVar66;
                        }
                        if (dVar65 <= 0.0) {
                          dVar66 = *(double *)(lVar42 + lVar34 * 8) + (dVar64 - dVar67) / dVar63;
LAB_00464088:
                          *(double *)(lVar42 + lVar34 * 8) = dVar66;
                        }
                        else {
                          dVar66 = *(double *)(lVar24 + lVar34 * 8);
                          if (0.0 < dVar66) {
                            dVar66 = dVar66 * ((dVar64 - dVar67) / dVar65);
                            goto LAB_00464088;
                          }
                        }
                      }
                      lVar24 = lVar24 + lVar59 * 8;
                      lVar42 = lVar42 + lVar30 * 8;
                    }
                    lVar50 = lVar50 + lVar41 * 8;
                    lVar25 = lVar25 + lVar39 * 8;
                  }
                }
              }
            }
            lVar27 = lVar27 + lVar44 * 8;
            lVar57 = lVar57 + lVar36 * lVar39 * 8;
          }
          for (; lVar25 <= lVar32; lVar25 = lVar25 + 1) {
            lVar27 = (lVar25 - lVar45) * lVar41;
            pdVar46 = local_1a8;
            for (lVar52 = lVar23; lVar52 <= lVar54; lVar52 = lVar52 + 1) {
              lVar26 = (lVar52 - lVar58) * lVar30;
              pdVar60 = pdVar46;
              for (lVar57 = (long)iVar28; lVar57 <= lVar37; lVar57 = lVar57 + 1) {
                pdVar13[lVar27 + lVar26 + (lVar57 - lVar40)] = 0.0;
                dVar63 = 0.0;
                pdVar35 = pdVar60;
                for (lVar50 = 1; lVar50 < ncomp + -1; lVar50 = lVar50 + 1) {
                  dVar63 = dVar63 + *pdVar35;
                  pdVar13[lVar27 + lVar26 + (lVar57 - lVar40)] = dVar63;
                  pdVar35 = pdVar35 + lVar44;
                }
                pdVar60 = pdVar60 + 1;
              }
              pdVar46 = pdVar46 + lVar30;
            }
            local_1a8 = local_1a8 + lVar41;
          }
          iVar29 = iVar29 + iVar10;
          bVar61 = iVar15 != crse_bx.bigend.vect[0] + -1;
          iVar15 = iVar15 + 1;
        } while (bVar61);
      }
      iVar49 = iVar49 + iVar11;
    }
    iVar55 = iVar55 + iVar12;
  } while( true );
}

Assistant:

void
CellConservativeProtected::protect (const FArrayBox& /*crse*/,
                                    int              /*crse_comp*/,
                                    FArrayBox&       fine,
                                    int              /*fine_comp*/,
                                    FArrayBox&       fine_state,
                                    int              /*state_comp*/,
                                    int              ncomp,
                                    const Box&       fine_region,
                                    const IntVect&   ratio,
                                    const Geometry&  crse_geom,
                                    const Geometry&  fine_geom,
                                    Vector<BCRec>&   /*bcr*/,
                                    RunOn            runon)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(fine,fine_state,
                         ncomp,fine_region,ratio,
                         crse_geom,fine_geom,runon);
    amrex::Abort("1D CellConservativeProtected::protect not supported");
#else
    BL_PROFILE("CellConservativeProtected::protect()");

    //
    // Make box which is intersection of fine_region and domain of fine.
    //
    Box target_fine_region = fine_region & fine.box();

    //
    // crse_bx is coarsening of target_fine_region, grown by 1.
    //
    Box crse_bx = CoarseBox(target_fine_region,ratio);

    //
    // cs_bx is coarsening of target_fine_region.
    //
    Box cs_bx(crse_bx);
    cs_bx.grow(-1);

#if (AMREX_SPACEDIM == 2)
    /*
     * Get coarse and fine geometry data.
     */
    GeometryData cs_geomdata = crse_geom.data();
    GeometryData fn_geomdata = fine_geom.data();
#else
    amrex::ignore_unused(crse_geom, fine_geom);
#endif

    // Extract box from fine fab
    const Box& fnbx = fine.box();

    // Extract pointers to fab data
    Array4<Real>       const&   fnarr = fine.array();
    Array4<Real const> const& fnstarr = fine_state.const_array();

    /*
     * Loop over coarse indices.
     */
#if (AMREX_SPACEDIM == 2)
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_2d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     cs_geomdata, fn_geomdata,
                     fnarr, fnstarr);
    }); // cs_bx
#else
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_3d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     fnarr, fnstarr);
    }); // cs_bx
#endif

#endif /*(AMREX_SPACEDIM == 1)*/

}